

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O0

bool ppmb_write(string *output_name,int xsize,int ysize,uchar *r,uchar *g,uchar *b)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  ostream *poVar5;
  int local_268;
  int local_264;
  int maxrgb;
  int j;
  uchar *indexr;
  uchar *indexg;
  uchar *indexb;
  long lStack_240;
  int i;
  ofstream output;
  bool error;
  uchar *b_local;
  uchar *g_local;
  uchar *r_local;
  int ysize_local;
  int xsize_local;
  string *output_name_local;
  
  std::ofstream::ofstream(&stack0xfffffffffffffdc0);
  _Var3 = std::__cxx11::string::c_str();
  std::ofstream::open((char *)&stack0xfffffffffffffdc0,_Var3);
  bVar1 = std::ios::operator!((ios *)((long)&stack0xfffffffffffffdc0 + *(long *)(lStack_240 + -0x18)
                                     ));
  if ((bVar1 & 1) == 0) {
    local_268 = 0;
    _maxrgb = r;
    indexr = g;
    indexg = b;
    for (local_264 = 0; local_264 < ysize; local_264 = local_264 + 1) {
      for (indexb._4_4_ = 0; indexb._4_4_ < xsize; indexb._4_4_ = indexb._4_4_ + 1) {
        iVar4 = i4_max(local_268,(uint)*_maxrgb);
        iVar4 = i4_max(iVar4,(uint)*indexr);
        local_268 = i4_max(iVar4,(uint)*indexg);
        _maxrgb = _maxrgb + 1;
        indexr = indexr + 1;
        indexg = indexg + 1;
      }
    }
    bVar2 = ppmb_write_header((ofstream *)&stack0xfffffffffffffdc0,xsize,ysize,local_268);
    if (bVar2) {
      std::operator<<((ostream *)&std::cout,"\n");
      std::operator<<((ostream *)&std::cout,"PPMB_WRITE: Fatal error!\n");
      std::operator<<((ostream *)&std::cout,"  PPMB_WRITE_HEADER failed.\n");
      output_name_local._7_1_ = true;
    }
    else {
      bVar2 = ppmb_write_data((ofstream *)&stack0xfffffffffffffdc0,xsize,ysize,r,g,b);
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,"\n");
        std::operator<<((ostream *)&std::cout,"PPMB_WRITE: Fatal error!\n");
        std::operator<<((ostream *)&std::cout,"  PPMB_WRITE_DATA failed.\n");
        output_name_local._7_1_ = true;
      }
      else {
        std::ofstream::close();
        output_name_local._7_1_ = false;
      }
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,"\n");
    std::operator<<((ostream *)&std::cout,"PPMB_WRITE: Fatal error!\n");
    poVar5 = std::operator<<((ostream *)&std::cout,"  Cannot open the output file ");
    poVar5 = std::operator<<(poVar5,(string *)output_name);
    std::operator<<(poVar5,".\n");
    output_name_local._7_1_ = true;
  }
  std::ofstream::~ofstream(&stack0xfffffffffffffdc0);
  return output_name_local._7_1_;
}

Assistant:

bool ppmb_write ( string output_name, int xsize, int ysize, 
  unsigned char *r, unsigned char *g, unsigned char *b )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_WRITE writes the header and data for a binary portable pixel map file.
//
//  Discussion:
//
//    Thanks to Jonas Schwertfeger for pointing out that, especially on Microsoft
//    Windows systems, a binary file needs to be opened as a binary file!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
// 
//    11 April 2003
// 
//  Author:
// 
//    John Burkardt
//
//  Parameters:
//
//    Input, string OUTPUT_NAME, the name of the file to contain the binary
//    portable pixel map data.
//
//    Input, int XSIZE, YSIZE, the number of rows and columns of data.
//
//    Input, unsigned char *R, *G, *B, the arrays of XSIZE by YSIZE 
//    data values.
//
//    Output, bool PPMB_WRITE, is true if an error occurred.
//
{
  bool error;
  ofstream output;
  int i;
  unsigned char *indexb;
  unsigned char *indexg;
  unsigned char *indexr;
  int j;
  int maxrgb;
//
//  Open the output file.
//
  output.open ( output_name.c_str ( ), ios::binary );

  if ( !output )
  {
    cout << "\n";
    cout << "PPMB_WRITE: Fatal error!\n";
    cout << "  Cannot open the output file " << output_name << ".\n";
    return true;
  }
//
//  Compute the maximum.
//
  maxrgb = 0;
  indexr = r;
  indexg = g;
  indexb = b;

  for ( j = 0; j < ysize; j++ )
  {
    for ( i = 0; i < xsize; i++ )
    {
      maxrgb = i4_max ( maxrgb, *indexr );
      maxrgb = i4_max ( maxrgb, *indexg );
      maxrgb = i4_max ( maxrgb, *indexb );
      indexr = indexr + 1;
      indexg = indexg + 1;
      indexb = indexb + 1;
    }
  }
//
//  Write the header.
//
  error = ppmb_write_header ( output, xsize, ysize, maxrgb );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE: Fatal error!\n";
    cout << "  PPMB_WRITE_HEADER failed.\n";
    return true;
  }
//
//  Write the data.
//
  error = ppmb_write_data ( output, xsize, ysize, r, g, b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE: Fatal error!\n";
    cout << "  PPMB_WRITE_DATA failed.\n";
    return true;
  }
//
//  Close the file.
//
  output.close ( );

  return false;
}